

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O2

int run_test_udp_send_unix(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *loop;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b_4;
  int64_t eval_b_6;
  uv_buf_t buf;
  undefined1 local_27e [18];
  undefined8 local_26c;
  undefined8 uStack_264;
  undefined8 local_25c;
  undefined8 uStack_254;
  undefined8 local_24c;
  undefined8 uStack_244;
  undefined8 local_23c;
  undefined8 uStack_234;
  undefined8 local_22c;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined8 uStack_218;
  uv_udp_t handle;
  uv_udp_send_t req;
  
  buf = (uv_buf_t)uv_buf_init("PING",4);
  loop = (uv_loop_t *)uv_default_loop();
  uStack_264 = 0;
  local_25c = 0;
  uStack_254 = 0;
  local_24c = 0;
  uStack_244 = 0;
  local_23c = 0;
  uStack_234 = 0;
  local_22c = 0;
  uStack_224 = 0;
  uStack_220 = 0;
  uStack_21c = 0;
  uStack_218 = 0;
  local_27e._0_2_ = 1;
  req.data = (void *)0x11;
  handle.data = (void *)0x6c;
  local_27e[2] = '/';
  local_27e[3] = 't';
  local_27e[4] = 'm';
  local_27e[5] = 'p';
  local_27e[6] = '/';
  local_27e[7] = 'u';
  local_27e[8] = 'v';
  local_27e[9] = '-';
  local_27e[10] = 't';
  local_27e[0xb] = 'e';
  local_27e[0xc] = 's';
  local_27e[0xd] = 't';
  local_27e[0xe] = '-';
  local_27e[0xf] = 's';
  local_27e[0x10] = 'o';
  local_27e[0x11] = 'c';
  local_26c = 0x6b;
  iVar1 = socket(1,1,0);
  req.data = (void *)(long)iVar1;
  handle.data = (void *)0x0;
  if ((long)req.data < 0) {
    pcVar6 = ">=";
    pcVar4 = "fd";
    uVar3 = 0x143;
LAB_001ab29a:
    handle.data = (void *)0x0;
  }
  else {
    unlink("/tmp/uv-test-sock");
    iVar2 = bind(iVar1,(sockaddr *)local_27e,0x6e);
    req.data = (void *)(long)iVar2;
    handle.data = (void *)0x0;
    if (req.data != (void *)0x0) {
      pcVar6 = "==";
      pcVar4 = "bind(fd, (const struct sockaddr*)&addr, sizeof addr)";
      uVar3 = 0x146;
      goto LAB_001ab29a;
    }
    iVar2 = listen(iVar1,1);
    req.data = (void *)(long)iVar2;
    handle.data = (void *)0x0;
    if (req.data != (void *)0x0) {
      pcVar6 = "==";
      pcVar4 = "listen(fd, 1)";
      uVar3 = 0x147;
      goto LAB_001ab29a;
    }
    iVar2 = uv_udp_init(loop,&handle);
    req.data = (void *)(long)iVar2;
    if (req.data == (void *)0x0) {
      iVar2 = uv_udp_open(&handle,iVar1);
      req.data = (void *)(long)iVar2;
      if (req.data == (void *)0x0) {
        uv_run(loop,0);
        iVar2 = uv_udp_send(&req,&handle,&buf,1,local_27e,0);
        eval_b_4 = (int64_t)iVar2;
        eval_b_6 = 0;
        if (eval_b_4 == 0) {
          uv_close(&handle,0);
          uv_run(loop,0);
          close(iVar1);
          unlink("/tmp/uv-test-sock");
          close_loop(loop);
          eval_b_4 = 0;
          iVar1 = uv_loop_close(loop);
          eval_b_6 = (int64_t)iVar1;
          if (eval_b_6 == 0) {
            uv_library_shutdown();
            return 0;
          }
          pcVar5 = "uv_loop_close(loop)";
          pcVar4 = "0";
          uVar3 = 0x15c;
        }
        else {
          pcVar5 = "0";
          pcVar4 = "r";
          uVar3 = 0x155;
        }
        pcVar6 = "==";
        goto LAB_001ab38e;
      }
      uVar3 = 0x14c;
    }
    else {
      uVar3 = 0x14a;
    }
    pcVar6 = "==";
    pcVar4 = "r";
  }
  eval_b_6 = 0;
  pcVar5 = "0";
  eval_b_4 = (int64_t)req.data;
LAB_001ab38e:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
          ,uVar3,pcVar4,pcVar6,pcVar5,eval_b_4,pcVar6,eval_b_6);
  abort();
}

Assistant:

TEST_IMPL(udp_send_unix) {
  /* Test that "uv_udp_send()" supports sending over
     a "sockaddr_un" address. */
  struct sockaddr_un addr;
  uv_udp_t handle;
  uv_udp_send_t req;
  uv_loop_t* loop;
  uv_buf_t buf = uv_buf_init("PING", 4);
  int fd;
  int r;

  loop = uv_default_loop();

  memset(&addr, 0, sizeof addr);
  addr.sun_family = AF_UNIX;
  ASSERT_LT(strlen(TEST_PIPENAME), sizeof(addr.sun_path));
  memcpy(addr.sun_path, TEST_PIPENAME, strlen(TEST_PIPENAME));

  fd = socket(AF_UNIX, SOCK_STREAM, 0);
  ASSERT_GE(fd, 0);

  unlink(TEST_PIPENAME);
  ASSERT_OK(bind(fd, (const struct sockaddr*)&addr, sizeof addr));
  ASSERT_OK(listen(fd, 1));

  r = uv_udp_init(loop, &handle);
  ASSERT_OK(r);
  r = uv_udp_open(&handle, fd);
  ASSERT_OK(r);
  uv_run(loop, UV_RUN_DEFAULT);

  r = uv_udp_send(&req,
                  &handle,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  NULL);
  ASSERT_OK(r);

  uv_close((uv_handle_t*)&handle, NULL);
  uv_run(loop, UV_RUN_DEFAULT);
  close(fd);
  unlink(TEST_PIPENAME);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}